

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

uint32 get_bits(vorb *f,int n)

{
  code *pcVar1;
  uint32 uVar2;
  uint32 uVar3;
  int iVar4;
  int in_ESI;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  int z_1;
  uint32 z;
  vorb *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint local_4;
  
  if (*(int *)(in_RDI + 0x6f8) < 0) {
    local_4 = 0;
  }
  else {
    if (*(int *)(in_RDI + 0x6f8) < in_ESI) {
      if (0x18 < in_ESI) {
        uVar2 = get_bits((vorb *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe4);
        uVar3 = get_bits((vorb *)CONCAT44(in_ESI,uVar2),in_stack_ffffffffffffffe4);
        return uVar3 * 0x1000000 + uVar2;
      }
      if (*(int *)(in_RDI + 0x6f8) == 0) {
        *(undefined4 *)(in_RDI + 0x6f4) = 0;
      }
      while (*(int *)(in_RDI + 0x6f8) < in_ESI) {
        iVar4 = get8_packet_raw(in_stack_ffffffffffffffd8);
        if (iVar4 == -1) {
          *(undefined4 *)(in_RDI + 0x6f8) = 0xffffffff;
          return 0;
        }
        *(int *)(in_RDI + 0x6f4) =
             (iVar4 << ((byte)*(undefined4 *)(in_RDI + 0x6f8) & 0x1f)) + *(int *)(in_RDI + 0x6f4);
        *(int *)(in_RDI + 0x6f8) = *(int *)(in_RDI + 0x6f8) + 8;
      }
    }
    do {
      if (in_ESI <= *(int *)(in_RDI + 0x6f8)) goto LAB_0013e1e3;
      iVar4 = SDL_ReportAssertion(&get_bits::sdl_assert_data,"get_bits",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                                  ,0x651);
    } while (iVar4 == 0);
    if (iVar4 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0013e1e3:
    local_4 = *(uint *)(in_RDI + 0x6f4) & (1 << ((byte)in_ESI & 0x1f)) - 1U;
    *(uint *)(in_RDI + 0x6f4) = *(uint *)(in_RDI + 0x6f4) >> ((byte)in_ESI & 0x1f);
    *(int *)(in_RDI + 0x6f8) = *(int *)(in_RDI + 0x6f8) - in_ESI;
  }
  return local_4;
}

Assistant:

static uint32 get_bits(vorb *f, int n)
{
   uint32 z;

   if (f->valid_bits < 0) return 0;
   if (f->valid_bits < n) {
      if (n > 24) {
         // the accumulator technique below would not work correctly in this case
         z = get_bits(f, 24);
         z += get_bits(f, n-24) << 24;
         return z;
      }
      if (f->valid_bits == 0) f->acc = 0;
      while (f->valid_bits < n) {
         int z = get8_packet_raw(f);
         if (z == EOP) {
            f->valid_bits = INVALID_BITS;
            return 0;
         }
         f->acc += z << f->valid_bits;
         f->valid_bits += 8;
      }
   }

   assert(f->valid_bits >= n);
   z = f->acc & ((1 << n)-1);
   f->acc >>= n;
   f->valid_bits -= n;
   return z;
}